

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_time.h
# Opt level: O3

uint64_t stm_round_to_common_refresh_rate(uint64_t ticks)

{
  uint64_t uVar1;
  uint uVar2;
  bool bVar3;
  
  uVar2 = 0;
  do {
    uVar1 = _stm_refresh_rates[uVar2][0];
    if (uVar1 == 0) {
      return ticks;
    }
    bVar3 = _stm_refresh_rates[uVar2][1] + uVar1 <= ticks ||
            ticks <= uVar1 - _stm_refresh_rates[uVar2][1];
    uVar2 = uVar2 + bVar3;
  } while (bVar3);
  return uVar1;
}

Assistant:

SOKOL_API_IMPL uint64_t stm_round_to_common_refresh_rate(uint64_t ticks) {
    uint64_t ns;
    int i = 0;
    while (0 != (ns = _stm_refresh_rates[i][0])) {
        uint64_t tol = _stm_refresh_rates[i][1];
        if ((ticks > (ns - tol)) && (ticks < (ns + tol))) {
            return ns;
        }
        i++;
    }
    // fallthough: didn't fit into any buckets
    return ticks;
}